

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# merl.cpp
# Opt level: O2

void release(void)

{
  GLboolean GVar1;
  long lVar2;
  
  if (g_gl.clocks[0] != (djg_clock *)0x0) {
    djgc_release(g_gl.clocks[0]);
  }
  for (lVar2 = 0; lVar2 != 3; lVar2 = lVar2 + 1) {
    if (g_gl.streams[lVar2] != (djg_buffer *)0x0) {
      djgb_release(g_gl.streams[lVar2]);
    }
  }
  for (lVar2 = 0; lVar2 != 0xc; lVar2 = lVar2 + 4) {
    GVar1 = (*glad_glIsProgram)(*(GLuint *)((long)g_gl.programs + lVar2));
    if (GVar1 != '\0') {
      (*glad_glDeleteProgram)(*(GLuint *)((long)g_gl.programs + lVar2));
    }
  }
  for (lVar2 = 0; lVar2 != 0x18; lVar2 = lVar2 + 4) {
    GVar1 = (*glad_glIsTexture)(*(GLuint *)((long)g_gl.textures + lVar2));
    if (GVar1 != '\0') {
      (*glad_glDeleteTextures)(1,(GLuint *)(lVar2 + 0x1fe8f4));
    }
  }
  for (lVar2 = 0; lVar2 != 0xc; lVar2 = lVar2 + 4) {
    GVar1 = (*glad_glIsBuffer)(*(GLuint *)((long)g_gl.buffers + lVar2));
    if (GVar1 != '\0') {
      (*glad_glDeleteBuffers)(1,(GLuint *)(lVar2 + 0x1fe914));
    }
  }
  for (lVar2 = 0; lVar2 != 8; lVar2 = lVar2 + 4) {
    GVar1 = (*glad_glIsFramebuffer)(*(GLuint *)((long)g_gl.framebuffers + lVar2));
    if (GVar1 != '\0') {
      (*glad_glDeleteFramebuffers)(1,(GLuint *)(lVar2 + 0x1fe8ec));
    }
  }
  for (lVar2 = 0; lVar2 != 8; lVar2 = lVar2 + 4) {
    GVar1 = (*glad_glIsVertexArray)(*(GLuint *)((long)g_gl.vertexArrays + lVar2));
    if (GVar1 != '\0') {
      (*glad_glDeleteVertexArrays)(1,(GLuint *)(lVar2 + 0x1fe90c));
    }
  }
  return;
}

Assistant:

void release()
{
    int i;

    for (i = 0; i < CLOCK_COUNT; ++i)
        if (g_gl.clocks[i])
            djgc_release(g_gl.clocks[i]);
    for (i = 0; i < STREAM_COUNT; ++i)
        if (g_gl.streams[i])
            djgb_release(g_gl.streams[i]);
    for (i = 0; i < PROGRAM_COUNT; ++i)
        if (glIsProgram(g_gl.programs[i]))
            glDeleteProgram(g_gl.programs[i]);
    for (i = 0; i < TEXTURE_COUNT; ++i)
        if (glIsTexture(g_gl.textures[i]))
            glDeleteTextures(1, &g_gl.textures[i]);
    for (i = 0; i < BUFFER_COUNT; ++i)
        if (glIsBuffer(g_gl.buffers[i]))
            glDeleteBuffers(1, &g_gl.buffers[i]);
    for (i = 0; i < FRAMEBUFFER_COUNT; ++i)
        if (glIsFramebuffer(g_gl.framebuffers[i]))
            glDeleteFramebuffers(1, &g_gl.framebuffers[i]);
    for (i = 0; i < VERTEXARRAY_COUNT; ++i)
        if (glIsVertexArray(g_gl.vertexArrays[i]))
            glDeleteVertexArrays(1, &g_gl.vertexArrays[i]);
}